

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O3

uint aom_highbd_avg_8x8_c(uint8_t *s8,int p)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  ulong *puVar11;
  int iVar12;
  int iVar13;
  
  puVar11 = (ulong *)((long)s8 * 2 + 8);
  iVar13 = 0;
  iVar12 = 8;
  do {
    uVar1 = puVar11[-1];
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3._12_2_ = (short)(uVar1 >> 0x30);
    auVar5._8_2_ = (short)(uVar1 >> 0x20);
    auVar5._0_8_ = uVar1;
    auVar5._10_4_ = auVar3._10_4_;
    auVar9._6_8_ = 0;
    auVar9._0_6_ = auVar5._8_6_;
    auVar7._4_2_ = (short)(uVar1 >> 0x10);
    auVar7._0_4_ = (uint)uVar1;
    auVar7._6_8_ = SUB148(auVar9 << 0x40,6);
    uVar2 = *puVar11;
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar2;
    auVar4._12_2_ = (short)(uVar2 >> 0x30);
    auVar6._8_2_ = (short)(uVar2 >> 0x20);
    auVar6._0_8_ = uVar2;
    auVar6._10_4_ = auVar4._10_4_;
    auVar10._6_8_ = 0;
    auVar10._0_6_ = auVar6._8_6_;
    auVar8._4_2_ = (short)(uVar2 >> 0x10);
    auVar8._0_4_ = (uint)uVar2;
    auVar8._6_8_ = SUB148(auVar10 << 0x40,6);
    iVar13 = (auVar4._10_4_ >> 0x10) + (auVar3._10_4_ >> 0x10) + auVar8._4_4_ + auVar7._4_4_ +
             auVar6._8_4_ + auVar5._8_4_ + ((uint)uVar2 & 0xffff) + ((uint)uVar1 & 0xffff) + iVar13;
    puVar11 = (ulong *)((long)puVar11 + (long)p * 2);
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  return iVar13 + 0x20 >> 6;
}

Assistant:

unsigned int aom_highbd_avg_8x8_c(const uint8_t *s8, int p) {
  int i, j;
  int sum = 0;
  const uint16_t *s = CONVERT_TO_SHORTPTR(s8);
  for (i = 0; i < 8; ++i, s += p)
    for (j = 0; j < 8; sum += s[j], ++j) {
    }

  return (sum + 32) >> 6;
}